

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_fileio.cpp
# Opt level: O1

Result_t * __thiscall
Kumu::DirScannerEx::GetNext
          (Result_t *__return_storage_ptr__,DirScannerEx *this,string *next_item_name,
          DirectoryEntryType_t *next_item_type)

{
  byte bVar1;
  dirent *pdVar2;
  DirectoryEntryType_t DVar3;
  undefined1 *rhs;
  
  if ((DIR *)this->m_Handle == (DIR *)0x0) {
    rhs = RESULT_FILEOPEN;
  }
  else {
    pdVar2 = readdir((DIR *)this->m_Handle);
    if (pdVar2 == (dirent *)0x0) {
      rhs = RESULT_ENDOFFILE;
    }
    else {
      strlen(pdVar2->d_name);
      std::__cxx11::string::_M_replace
                ((ulong)next_item_name,0,(char *)next_item_name->_M_string_length,
                 (ulong)pdVar2->d_name);
      bVar1 = pdVar2->d_type - 4;
      DVar3 = DET_DEV;
      if (bVar1 < 7) {
        DVar3 = *(DirectoryEntryType_t *)(&DAT_0011d870 + (ulong)bVar1 * 4);
      }
      *next_item_type = DVar3;
      rhs = RESULT_OK;
    }
  }
  Result_t::Result_t(__return_storage_ptr__,(Result_t *)rhs);
  return __return_storage_ptr__;
}

Assistant:

Result_t
Kumu::DirScannerEx::GetNext(std::string& next_item_name, DirectoryEntryType_t& next_item_type)
{
  if ( m_Handle == 0 )
    return RESULT_FILEOPEN;

#if defined(__sun) && defined(__SVR4)
  struct stat s;
#endif
  struct dirent* entry;

  for (;;)
    {
      if ( ( entry = readdir(m_Handle) ) == 0 )
	return RESULT_ENDOFFILE;

      break;
    }

  next_item_name.assign(entry->d_name, strlen(entry->d_name));

#if defined(__sun) && defined(__SVR4)

  stat(entry->d_name, &s);

  switch ( s.st_mode )
    {
    case S_IFDIR:
      next_item_type = DET_DIR;
      break;

    case S_IFREG:
      next_item_type = DET_FILE;
      break;

    case S_IFLNK:
      next_item_type = DET_LINK;
      break;

    default:
      next_item_type = DET_DEV;
    }
#else // __sun 
  switch ( entry->d_type )
    {
    case DT_DIR:
      next_item_type = DET_DIR;
      break;

    case DT_REG:
      next_item_type = DET_FILE;
      break;

    case DT_LNK:
      next_item_type = DET_LINK;
      break;

    default:
      next_item_type = DET_DEV;
    }
#endif // __sun
  return RESULT_OK;
}